

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

char * vkb::to_string(QueueError err)

{
  if (err < (queue_index_out_of_range|compute_unavailable)) {
    return (&PTR_anon_var_dwarf_832e0_0015fd10)[err];
  }
  return "";
}

Assistant:

const char* to_string(QueueError err) {
    switch (err) {
        CASE_TO_STRING(QueueError, present_unavailable)
        CASE_TO_STRING(QueueError, graphics_unavailable)
        CASE_TO_STRING(QueueError, compute_unavailable)
        CASE_TO_STRING(QueueError, transfer_unavailable)
        CASE_TO_STRING(QueueError, queue_index_out_of_range)
        CASE_TO_STRING(QueueError, invalid_queue_family_index)
        default:
            return "";
    }
}